

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowTitleBarContents
               (ImGuiWindow *window,ImRect *title_bar_rect,char *name,bool *p_open)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  undefined1 *in_RCX;
  ImRect *in_RSI;
  long in_RDI;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  ImVec2 off;
  ImVec2 marker_pos;
  ImRect clip_r;
  ImRect layout_r;
  float pad_extend;
  float centerness;
  ImVec2 text_size;
  float marker_size_x;
  char *UNSAVED_DOCUMENT_MARKER;
  ImVec2 collapse_button_pos;
  ImVec2 close_button_pos;
  float button_sz;
  float pad_r;
  float pad_l;
  ImGuiItemFlags item_flags_backup;
  bool has_collapse_button;
  bool has_close_button;
  ImGuiWindowFlags flags;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffeb8;
  ImRect *in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined1 hide_text_after_double_hash;
  ImGuiWindow *in_stack_fffffffffffffed0;
  ImVec2 *in_stack_fffffffffffffed8;
  ImVec2 *pIVar7;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffeec;
  ImVec2 *this;
  undefined4 in_stack_fffffffffffffef8;
  float fVar8;
  uint3 in_stack_ffffffffffffff00;
  uint uVar9;
  float in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  ImVec2 local_e4;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float local_b0;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ImGuiID in_stack_ffffffffffffff70;
  float local_8c;
  float local_84;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  float local_44;
  float local_40;
  undefined4 local_3c;
  byte local_36;
  byte local_35;
  uint local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  undefined1 *local_20;
  ImRect *local_10;
  long local_8;
  
  pIVar1 = GImGui;
  local_28 = GImGui;
  local_30 = &GImGui->Style;
  local_34 = *(uint *)(in_RDI + 0xc);
  local_35 = in_RCX != (undefined1 *)0x0;
  uVar9 = (uint)in_stack_ffffffffffffff00;
  if ((local_34 & 0x20) == 0) {
    uVar9 = CONCAT13((GImGui->Style).WindowMenuButtonPosition != -1,in_stack_ffffffffffffff00);
  }
  local_36 = (byte)(uVar9 >> 0x18);
  local_3c = *(undefined4 *)(in_RDI + 0x1cc);
  *(uint *)(in_RDI + 0x1cc) = *(uint *)(in_RDI + 0x1cc) | 0x10;
  *(undefined4 *)(in_RDI + 0x14c) = 1;
  local_40 = (pIVar1->Style).FramePadding.x;
  local_44 = (pIVar1->Style).FramePadding.x;
  local_48 = pIVar1->FontSize;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ImVec2::ImVec2(&local_50);
  ImVec2::ImVec2(&local_58);
  if ((local_35 & 1) != 0) {
    local_44 = local_48 + local_44;
    ImVec2::ImVec2(&local_60,((local_10->Max).x - local_44) - (local_30->FramePadding).x,
                   (local_10->Min).y);
    local_50 = local_60;
  }
  if (((local_36 & 1) != 0) && (local_30->WindowMenuButtonPosition == 1)) {
    local_44 = local_48 + local_44;
    ImVec2::ImVec2(&local_68,((local_10->Max).x - local_44) - (local_30->FramePadding).x,
                   (local_10->Min).y);
    local_58 = local_68;
  }
  if (((local_36 & 1) != 0) && (local_30->WindowMenuButtonPosition == 0)) {
    ImVec2::ImVec2(&local_70,((local_10->Min).x + local_40) - (local_30->FramePadding).x,
                   (local_10->Min).y);
    local_58 = local_70;
    local_40 = local_48 + local_40;
  }
  if ((local_36 & 1) != 0) {
    ImGuiWindow::GetID(in_stack_fffffffffffffed0,
                       (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                       (char *)in_stack_fffffffffffffec0);
    bVar2 = CollapseButton((ImGuiID)in_stack_ffffffffffffff54,
                           (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (bVar2) {
      *(undefined1 *)(local_8 + 0x92) = 1;
    }
  }
  if ((local_35 & 1) != 0) {
    ImGuiWindow::GetID(in_stack_fffffffffffffed0,
                       (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                       (char *)in_stack_fffffffffffffec0);
    bVar2 = CloseButton(in_stack_ffffffffffffff70,
                        (ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (bVar2) {
      *local_20 = 0;
    }
  }
  hide_text_after_double_hash = (undefined1)((uint)in_stack_fffffffffffffecc >> 0x18);
  *(undefined4 *)(local_8 + 0x14c) = 0;
  *(undefined4 *)(local_8 + 0x1cc) = local_3c;
  if ((local_34 & 0x100000) == 0) {
    local_84 = 0.0;
  }
  else {
    IVar6 = CalcTextSize((char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                         (bool)hide_text_after_double_hash,in_stack_fffffffffffffec8);
    local_84 = IVar6.x;
  }
  fVar8 = local_84;
  CalcTextSize((char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
               (bool)hide_text_after_double_hash,in_stack_fffffffffffffec8);
  this = (ImVec2 *)&stack0xffffffffffffff64;
  ImVec2::ImVec2(this,local_84,0.0);
  IVar6 = operator+(in_stack_fffffffffffffea8,(ImVec2 *)0x161ab0);
  if ((local_30->FramePadding).x <= local_40 && local_40 != (local_30->FramePadding).x) {
    local_40 = (local_28->Style).ItemInnerSpacing.x + local_40;
  }
  if ((local_30->FramePadding).x <= local_44 && local_44 != (local_30->FramePadding).x) {
    local_44 = (local_28->Style).ItemInnerSpacing.x + local_44;
  }
  local_8c = IVar6.x;
  if ((0.0 < (local_30->WindowTitleAlign).x) &&
     ((local_30->WindowTitleAlign).x <= 1.0 && (local_30->WindowTitleAlign).x != 1.0)) {
    fVar3 = -ABS((local_30->WindowTitleAlign).x - 0.5);
    fVar3 = ImSaturate(fVar3 + fVar3 + 1.0);
    in_stack_fffffffffffffeec = ImMax<float>(local_40,local_44);
    fVar4 = ImRect::GetWidth(local_10);
    fVar4 = ImMin<float>(in_stack_fffffffffffffeec,((fVar4 - local_40) - local_44) - local_8c);
    local_40 = ImMax<float>(local_40,fVar4 * fVar3);
    local_44 = ImMax<float>(local_44,fVar4 * fVar3);
  }
  ImRect::ImRect(in_stack_fffffffffffffec0,(float)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 (float)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                 in_stack_fffffffffffffeb0);
  fVar3 = local_b0;
  fVar4 = in_stack_ffffffffffffff4c;
  ImMin<float>((in_stack_ffffffffffffff54 + (local_28->Style).ItemInnerSpacing.x) - 2.1,
               (local_10->Max).x);
  ImRect::ImRect(in_stack_fffffffffffffec0,(float)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                 (float)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                 in_stack_fffffffffffffeb0);
  pIVar7 = &local_c4;
  RenderTextClipped((ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,uVar9),
                    (ImVec2 *)CONCAT44(fVar8,in_stack_fffffffffffffef8),(char *)this,
                    (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_ffffffffffffff4c),
                    (ImVec2 *)CONCAT44(fVar3,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8,
                    (ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if ((local_34 & 0x100000) != 0) {
    fVar5 = ImRect::GetWidth((ImRect *)&stack0xffffffffffffff4c);
    fVar4 = ImMax<float>(fVar4,(fVar5 - local_8c) * (local_30->WindowTitleAlign).x + fVar4);
    ImVec2::ImVec2(&local_d4,fVar4 + local_8c,local_b0);
    fVar4 = 0.0;
    ImVec2::ImVec2(&local_dc,2.0 - local_84,0.0);
    local_cc = operator+(pIVar7,(ImVec2 *)0x161e31);
    ImVec2::ImVec2(&local_e4,fVar4,(float)(int)(local_28->FontSize * -0.25));
    IVar6 = operator+(pIVar7,(ImVec2 *)0x161e87);
    fVar5 = IVar6.x;
    IVar6 = operator+(pIVar7,(ImVec2 *)0x161e9f);
    fVar4 = IVar6.y;
    pIVar7 = (ImVec2 *)0x1e6162;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff04,0.0,(local_30->WindowTitleAlign).y);
    RenderTextClipped((ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,uVar9),
                      (ImVec2 *)CONCAT44(fVar8,in_stack_fffffffffffffef8),(char *)this,
                      (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_ffffffffffffff4c),
                      (ImVec2 *)CONCAT44(fVar3,in_stack_fffffffffffffee0),pIVar7,
                      (ImRect *)CONCAT44(fVar5,fVar4));
  }
  return;
}

Assistant:

void ImGui::RenderWindowTitleBarContents(ImGuiWindow* window, const ImRect& title_bar_rect, const char* name, bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImGuiWindowFlags flags = window->Flags;

    const bool has_close_button = (p_open != NULL);
    const bool has_collapse_button = !(flags & ImGuiWindowFlags_NoCollapse) && (style.WindowMenuButtonPosition != ImGuiDir_None);

    // Close & Collapse button are on the Menu NavLayer and don't default focus (unless there's nothing else on that layer)
    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNavDefaultFocus;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;

    // Layout buttons
    // FIXME: Would be nice to generalize the subtleties expressed here into reusable code.
    float pad_l = style.FramePadding.x;
    float pad_r = style.FramePadding.x;
    float button_sz = g.FontSize;
    ImVec2 close_button_pos;
    ImVec2 collapse_button_pos;
    if (has_close_button)
    {
        pad_r += button_sz;
        close_button_pos = ImVec2(title_bar_rect.Max.x - pad_r - style.FramePadding.x, title_bar_rect.Min.y);
    }
    if (has_collapse_button && style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        pad_r += button_sz;
        collapse_button_pos = ImVec2(title_bar_rect.Max.x - pad_r - style.FramePadding.x, title_bar_rect.Min.y);
    }
    if (has_collapse_button && style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        collapse_button_pos = ImVec2(title_bar_rect.Min.x + pad_l - style.FramePadding.x, title_bar_rect.Min.y);
        pad_l += button_sz;
    }

    // Collapse button (submitting first so it gets priority when choosing a navigation init fallback)
    if (has_collapse_button)
        if (CollapseButton(window->GetID("#COLLAPSE"), collapse_button_pos))
            window->WantCollapseToggle = true; // Defer actual collapsing to next frame as we are too far in the Begin() function

    // Close button
    if (has_close_button)
        if (CloseButton(window->GetID("#CLOSE"), close_button_pos))
            *p_open = false;

    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;
    window->DC.ItemFlags = item_flags_backup;

    // Title bar text (with: horizontal alignment, avoiding collapse/close button, optional "unsaved document" marker)
    // FIXME: Refactor text alignment facilities along with RenderText helpers, this is WAY too much messy code..
    const char* UNSAVED_DOCUMENT_MARKER = "*";
    const float marker_size_x = (flags & ImGuiWindowFlags_UnsavedDocument) ? CalcTextSize(UNSAVED_DOCUMENT_MARKER, NULL, false).x : 0.0f;
    const ImVec2 text_size = CalcTextSize(name, NULL, true) + ImVec2(marker_size_x, 0.0f);

    // As a nice touch we try to ensure that centered title text doesn't get affected by visibility of Close/Collapse button,
    // while uncentered title text will still reach edges correctly.
    if (pad_l > style.FramePadding.x)
        pad_l += g.Style.ItemInnerSpacing.x;
    if (pad_r > style.FramePadding.x)
        pad_r += g.Style.ItemInnerSpacing.x;
    if (style.WindowTitleAlign.x > 0.0f && style.WindowTitleAlign.x < 1.0f)
    {
        float centerness = ImSaturate(1.0f - ImFabs(style.WindowTitleAlign.x - 0.5f) * 2.0f); // 0.0f on either edges, 1.0f on center
        float pad_extend = ImMin(ImMax(pad_l, pad_r), title_bar_rect.GetWidth() - pad_l - pad_r - text_size.x);
        pad_l = ImMax(pad_l, pad_extend * centerness);
        pad_r = ImMax(pad_r, pad_extend * centerness);
    }

    ImRect layout_r(title_bar_rect.Min.x + pad_l, title_bar_rect.Min.y, title_bar_rect.Max.x - pad_r, title_bar_rect.Max.y);
    ImRect clip_r(layout_r.Min.x, layout_r.Min.y, ImMin(layout_r.Max.x + g.Style.ItemInnerSpacing.x - 2.1f, title_bar_rect.Max.x), layout_r.Max.y);
    //if (g.IO.KeyShift) window->DrawList->AddRect(layout_r.Min, layout_r.Max, IM_COL32(255, 128, 0, 255)); // [DEBUG]
    //if (g.IO.KeyCtrl) window->DrawList->AddRect(clip_r.Min, clip_r.Max, IM_COL32(255, 128, 0, 255)); // [DEBUG]
    RenderTextClipped(layout_r.Min, layout_r.Max, name, NULL, &text_size, style.WindowTitleAlign, &clip_r);
    if (flags & ImGuiWindowFlags_UnsavedDocument)
    {
        ImVec2 marker_pos = ImVec2(ImMax(layout_r.Min.x, layout_r.Min.x + (layout_r.GetWidth() - text_size.x) * style.WindowTitleAlign.x) + text_size.x, layout_r.Min.y) + ImVec2(2 - marker_size_x, 0.0f);
        ImVec2 off = ImVec2(0.0f, IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClipped(marker_pos + off, layout_r.Max + off, UNSAVED_DOCUMENT_MARKER, NULL, NULL, ImVec2(0, style.WindowTitleAlign.y), &clip_r);
    }
}